

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O2

void __thiscall icu_63::double_conversion::Bignum::AddBignum(Bignum *this,Bignum *other)

{
  uint uVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uint *puVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  
  Align(this,other);
  iVar3 = this->exponent_;
  iVar7 = this->used_digits_ + iVar3;
  iVar9 = other->used_digits_;
  iVar4 = other->exponent_ + iVar9;
  if (iVar7 <= iVar4) {
    iVar7 = iVar4;
  }
  if ((iVar7 - iVar3) + 1 < 0x81) {
    iVar3 = other->exponent_ - iVar3;
    puVar6 = (this->bigits_).start_;
    puVar2 = (other->bigits_).start_;
    lVar5 = (long)iVar3 << 2;
    uVar8 = 0;
    for (lVar10 = 0; lVar10 < iVar9; lVar10 = lVar10 + 1) {
      uVar8 = uVar8 + *(int *)((long)puVar6 + lVar5) + puVar2[lVar10];
      *(uint *)((long)puVar6 + lVar5) = uVar8 & 0xfffffff;
      uVar8 = uVar8 >> 0x1c;
      iVar9 = other->used_digits_;
      iVar3 = iVar3 + 1;
      lVar5 = lVar5 + 4;
    }
    puVar6 = (uint *)(lVar5 + (long)(this->bigits_).start_);
    for (; uVar8 != 0; uVar8 = uVar8 + uVar1 >> 0x1c) {
      uVar1 = *puVar6;
      *puVar6 = uVar8 + uVar1 & 0xfffffff;
      iVar3 = iVar3 + 1;
      puVar6 = puVar6 + 1;
    }
    iVar4 = this->used_digits_;
    if (this->used_digits_ < iVar3) {
      iVar4 = iVar3;
    }
    this->used_digits_ = iVar4;
    return;
  }
  abort();
}

Assistant:

void Bignum::AddBignum(const Bignum& other) {
  ASSERT(IsClamped());
  ASSERT(other.IsClamped());

  // If this has a greater exponent than other append zero-bigits to this.
  // After this call exponent_ <= other.exponent_.
  Align(other);

  // There are two possibilities:
  //   aaaaaaaaaaa 0000  (where the 0s represent a's exponent)
  //     bbbbb 00000000
  //   ----------------
  //   ccccccccccc 0000
  // or
  //    aaaaaaaaaa 0000
  //  bbbbbbbbb 0000000
  //  -----------------
  //  cccccccccccc 0000
  // In both cases we might need a carry bigit.

  EnsureCapacity(1 + Max(BigitLength(), other.BigitLength()) - exponent_);
  Chunk carry = 0;
  int bigit_pos = other.exponent_ - exponent_;
  ASSERT(bigit_pos >= 0);
  for (int i = 0; i < other.used_digits_; ++i) {
    Chunk sum = bigits_[bigit_pos] + other.bigits_[i] + carry;
    bigits_[bigit_pos] = sum & kBigitMask;
    carry = sum >> kBigitSize;
    bigit_pos++;
  }

  while (carry != 0) {
    Chunk sum = bigits_[bigit_pos] + carry;
    bigits_[bigit_pos] = sum & kBigitMask;
    carry = sum >> kBigitSize;
    bigit_pos++;
  }
  used_digits_ = Max(bigit_pos, used_digits_);
  ASSERT(IsClamped());
}